

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

size_t __thiscall
CDBWrapper::EstimateSize<unsigned_char>(CDBWrapper *this,uchar *key_begin,uchar *key_end)

{
  long lVar1;
  Span<const_std::byte> key2;
  Span<const_std::byte> key1;
  size_t sVar2;
  CDBWrapper *in_RDX;
  long in_FS_OFFSET;
  DataStream ssKey2;
  DataStream ssKey1;
  DataStream *in_stack_ffffffffffffff38;
  DataStream *in_stack_ffffffffffffff40;
  DataStream *in_stack_ffffffffffffff48;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = 0;
  sVar2 = 0;
  pbVar4 = (byte *)0x0;
  DataStream::DataStream(in_stack_ffffffffffffff38);
  pbVar3 = (byte *)0x0;
  DataStream::DataStream(in_stack_ffffffffffffff38);
  DataStream::reserve(in_stack_ffffffffffffff38,0x141e3a0);
  DataStream::reserve(in_stack_ffffffffffffff38,0x141e3b4);
  DataStream::operator<<(in_stack_ffffffffffffff48,(uchar *)in_stack_ffffffffffffff40);
  DataStream::operator<<(in_stack_ffffffffffffff48,(uchar *)in_stack_ffffffffffffff40);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  key1.m_size = sVar5;
  key1.m_data = pbVar4;
  key2.m_size = sVar2;
  key2.m_data = pbVar3;
  sVar2 = EstimateSizeImpl(in_RDX,key1,key2);
  DataStream::~DataStream(in_stack_ffffffffffffff38);
  DataStream::~DataStream(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t EstimateSize(const K& key_begin, const K& key_end) const
    {
        DataStream ssKey1{}, ssKey2{};
        ssKey1.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey2.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey1 << key_begin;
        ssKey2 << key_end;
        return EstimateSizeImpl(ssKey1, ssKey2);
    }